

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

bool __thiscall
RtApiAlsa::probeDeviceOpen
          (RtApiAlsa *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  ostringstream *poVar1;
  pthread_cond_t *__cond;
  snd_pcm_t *__arg;
  long lVar2;
  RtAudioFormat RVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  snd_pcm_t sVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  size_t sVar15;
  ostream *poVar16;
  char *pcVar17;
  void *pvVar18;
  undefined8 *puVar19;
  int i;
  pointer ppVar20;
  string *psVar21;
  undefined1 *__s;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [12];
  sched_param local_dc;
  uint uStack_d8;
  sched_param param;
  snd_pcm_uframes_t periodSize;
  snd_pcm_uframes_t val;
  uint local_c0;
  int dir;
  uint sampleRate_local;
  pthread_attr_t attr;
  long lStack_78;
  uint value;
  size_type *local_70;
  string name;
  uint local_44;
  long lStack_40;
  uint periods;
  snd_pcm_t *phandle;
  snd_pcm_t *psVar22;
  
  __s = auStack_e8;
  local_70 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  for (ppVar20 = (this->deviceIdPairs_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_c0 = sampleRate,
      ppVar20 !=
      (this->deviceIdPairs_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar20 = ppVar20 + 1) {
    if (ppVar20->second == deviceId) {
      uStack_f0 = 0x18ce83;
      std::__cxx11::string::_M_assign((string *)&local_70);
      break;
    }
  }
  uStack_f0 = 0x18ce9d;
  iVar9 = snd_pcm_open(&stack0xffffffffffffffc0,local_70,mode != OUTPUT,2);
  if (iVar9 < 0) {
    poVar1 = &(this->super_RtApi).errorStream_;
    if (mode == OUTPUT) {
      uStack_f0 = 0x18d015;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::probeDeviceOpen: pcm device (",0x28);
      uStack_f0 = 0x18d025;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,(char *)local_70,(long)name._M_dataplus._M_p);
      lVar14 = 0x18;
      pcVar17 = ") won\'t open for output.";
    }
    else {
      uStack_f0 = 0x18cf65;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::probeDeviceOpen: pcm device (",0x28);
      uStack_f0 = 0x18cf75;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,(char *)local_70,(long)name._M_dataplus._M_p);
      lVar14 = 0x17;
      pcVar17 = ") won\'t open for input.";
    }
    uStack_f0 = 0x18d039;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,lVar14);
    uStack_f0 = 0x18d049;
    std::__cxx11::stringbuf::str();
    psVar21 = (string *)&(this->super_RtApi).errorText_;
LAB_0018dda3:
    *(undefined8 *)(__s + -8) = 0x18ddab;
    std::__cxx11::string::operator=(psVar21,(string *)&sampleRate_local);
    if ((char *)_sampleRate_local != attr.__size + 8) {
      *(undefined8 *)(__s + -8) = 0x18ddbf;
      operator_delete((void *)_sampleRate_local);
    }
  }
  else {
    name.field_2._8_4_ = channels;
    uStack_f0 = 0x18ceb8;
    dir = firstChannel;
    phandle = (snd_pcm_t *)this;
    lVar14 = snd_pcm_hw_params_sizeof();
    lVar14 = -(lVar14 + 0xfU & 0xfffffffffffffff0);
    __s = auStack_e8 + lVar14;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cece;
    sVar15 = snd_pcm_hw_params_sizeof();
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cedb;
    memset(__s,0,sVar15);
    lVar2 = lStack_40;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cee7;
    iVar9 = snd_pcm_hw_params_any(lVar2,__s);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cf8f;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cfab;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error getting pcm device (",0x36);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cfbb;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cfd2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") parameters, ",0xe);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cfda;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar4 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d0a0;
        std::ios::clear((int)poVar16 + (int)uVar4);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cfee;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cffc;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d0b4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d0c8;
      std::__cxx11::stringbuf::str();
LAB_0018dd92:
      psVar21 = (string *)(psVar22 + 0x180);
      goto LAB_0018dda3;
    }
    if ((options == (StreamOptions *)0x0) || ((options->flags & 1) == 0)) {
      phandle[0x21a] = (snd_pcm_t)0x1;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cf20;
      iVar9 = snd_pcm_hw_params_set_access(lVar2,__s,3);
      lVar2 = lStack_40;
      if (iVar9 < 0) {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18cf3c;
        iVar9 = snd_pcm_hw_params_set_access(lVar2,__s,4);
        goto LAB_0018d082;
      }
LAB_0018d0e1:
      sVar8 = (snd_pcm_t)0x1;
    }
    else {
      phandle[0x21a] = (snd_pcm_t)0x0;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d07b;
      iVar9 = snd_pcm_hw_params_set_access(lVar2,__s,4);
      lVar2 = lStack_40;
      if (iVar9 < 0) {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d0de;
        iVar9 = snd_pcm_hw_params_set_access(lVar2,__s,3);
        goto LAB_0018d0e1;
      }
LAB_0018d082:
      sVar8 = (snd_pcm_t)0x0;
    }
    lVar2 = lStack_40;
    lStack_78 = (long)mode;
    phandle[lStack_78 + 0x21b] = sVar8;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d134;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d150;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting pcm device (",0x36);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d160;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d177;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") access, ",10);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d17f;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar4 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d1cd;
        std::ios::clear((int)poVar16 + (int)uVar4);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d18f;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d19d;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d1e1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d1f5;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    *(RtAudioFormat *)(phandle + 600) = format;
    switch(format) {
    case 1:
      iVar9 = 0;
      break;
    case 2:
      iVar9 = 2;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_0018d121_caseD_3:
      iVar9 = -1;
      break;
    case 4:
      iVar9 = 6;
      break;
    case 8:
      iVar9 = 10;
      break;
    default:
      if (format == 0x10) {
        iVar9 = 0xe;
      }
      else {
        if (format != 0x20) goto switchD_0018d121_caseD_3;
        iVar9 = 0x10;
      }
    }
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d22f;
    iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,iVar9);
    lVar2 = lStack_40;
    if (iVar10 != 0) {
      iVar9 = 0x10;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d24e;
      iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,0x10);
      lVar2 = lStack_40;
      if (iVar10 == 0) {
        format = 0x20;
      }
      else {
        iVar9 = 0xe;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d26d;
        iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,0xe);
        lVar2 = lStack_40;
        if (iVar10 == 0) {
          format = 0x10;
        }
        else {
          iVar9 = 10;
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d28c;
          iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,10);
          lVar2 = lStack_40;
          if (iVar10 == 0) {
            format = 8;
          }
          else {
            iVar9 = 6;
            *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d2ab;
            iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,6);
            lVar2 = lStack_40;
            if (iVar10 == 0) {
              format = 4;
            }
            else {
              iVar9 = 2;
              *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d2ca;
              iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,2);
              lVar2 = lStack_40;
              if (iVar10 == 0) {
                format = 2;
              }
              else {
                iVar9 = 0;
                *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d2e3;
                iVar10 = snd_pcm_hw_params_test_format(lVar2,__s,0);
                lVar2 = lStack_40;
                if (iVar10 != 0) {
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d2f4;
                  snd_pcm_close(lVar2);
                  poVar16 = (ostream *)(phandle + 8);
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d310;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"RtApiAlsa::probeDeviceOpen: pcm device (",0x28);
                  _Var7 = name._M_dataplus;
                  psVar6 = local_70;
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d320;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,(char *)psVar6,(long)_Var7._M_p);
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d334;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,") data format not supported by RtAudio.",0x27);
                  psVar22 = phandle;
                  *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d348;
                  std::__cxx11::stringbuf::str();
                  goto LAB_0018dd92;
                }
                format = 1;
              }
            }
          }
        }
      }
    }
    lVar2 = lStack_40;
    *(RtAudioFormat *)(phandle + lStack_78 * 8 + 0x260) = format;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d394;
    iVar10 = snd_pcm_hw_params_set_format(lVar2,__s,iVar9);
    lVar2 = lStack_40;
    if (iVar10 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d454;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d470;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting pcm device (",0x36);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d480;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d497;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") data format, ",0xf);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d49e;
      pcVar17 = (char *)snd_strerror(iVar10);
      if (pcVar17 == (char *)0x0) {
        uVar4 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d63a;
        std::ios::clear((int)poVar16 + (int)uVar4);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d4b2;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d4c0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d64e;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d662;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    phandle[lStack_78 + 0x21d] = (snd_pcm_t)0x0;
    if (iVar9 != 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d3bf;
      iVar9 = snd_pcm_format_cpu_endian(iVar9);
      lVar2 = lStack_40;
      if (iVar9 == 0) {
        phandle[lStack_78 + 0x21d] = (snd_pcm_t)0x1;
      }
      else if (iVar9 < 0) {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d3d9;
        snd_pcm_close(lVar2);
        poVar16 = (ostream *)(phandle + 8);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d3f5;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDeviceOpen: error getting pcm device (",0x36);
        _Var7 = name._M_dataplus;
        psVar6 = local_70;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d405;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)psVar6,(long)_Var7._M_p);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d41c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,") endian-ness, ",0xf);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d424;
        pcVar17 = (char *)snd_strerror(iVar9);
        if (pcVar17 == (char *)0x0) {
          uVar4 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dadf;
          std::ios::clear((int)poVar16 + (int)uVar4);
        }
        else {
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d438;
          sVar15 = strlen(pcVar17);
          *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d446;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
        }
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18daf3;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        psVar22 = phandle;
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db07;
        std::__cxx11::stringbuf::str();
        goto LAB_0018dd92;
      }
    }
    lVar2 = lStack_40;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d4ea;
    iVar9 = snd_pcm_hw_params_set_rate_near(lVar2,__s,&local_c0,0);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d5af;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d5cb;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting sample rate on device (",0x41);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d5db;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d5f2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d5f9;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar4 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da0c;
        std::ios::clear((int)poVar16 + (int)uVar4);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d60d;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d61b;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da34;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    *(undefined4 *)(phandle + lStack_78 * 4 + 0x22c) = name.field_2._8_4_;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d512;
    iVar9 = snd_pcm_hw_params_get_channels_max(__s,attr.__size + 0x34);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
LAB_0018d52b:
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d534;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d550;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device ("
                 ,0x52);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d560;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d577;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d57f;
      pcVar17 = (char *)snd_strerror(iVar9);
      if (pcVar17 == (char *)0x0) {
        uVar4 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d9c5;
        std::ios::clear((int)poVar16 + (int)uVar4);
      }
      else {
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d593;
        sVar15 = strlen(pcVar17);
        *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d5a1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar15);
      }
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d9d9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d9ed;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    uVar11 = name.field_2._8_4_ + dir;
    if ((uint)attr._52_4_ < (uint)uVar11) goto LAB_0018d52b;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d675;
    iVar9 = snd_pcm_hw_params_get_channels_min(__s,attr.__size + 0x34);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da42;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da5e;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error getting minimum channels for device (",
                 0x47);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da6e;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da85;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da8d;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18da98;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18daac;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dac0;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    if ((uint)uVar11 < (uint)attr._52_4_) {
      uVar11 = attr._52_4_;
    }
    *(undefined4 *)(phandle + lStack_78 * 4 + 0x234) = uVar11;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d6a5;
    iVar9 = snd_pcm_hw_params_set_channels(lVar2,__s,uVar11);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db15;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db31;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting channels for device (",0x3f);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db41;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db58;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db5f;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db6a;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db7e;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18db92;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    val._4_4_ = 0;
    _uStack_d8 = (ulong)*bufferSize;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d6d9;
    iVar9 = snd_pcm_hw_params_set_period_size_near(lVar2,__s);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dba0;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dbbc;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting period size for device (",0x42);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dbcc;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dbe3;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dbea;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dbf5;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc09;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc1d;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    *bufferSize = uStack_d8;
    local_44 = 0;
    if (options != (StreamOptions *)0x0) {
      if ((options->flags & 2) != 0) {
        local_44 = 2;
      }
      if (options->numberOfBuffers != 0) {
        local_44 = options->numberOfBuffers;
      }
    }
    if (local_44 < 2) {
      local_44 = 4;
    }
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d736;
    iVar9 = snd_pcm_hw_params_set_periods_near(lVar2,__s,&local_44,(long)&val + 4);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc2b;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc47;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDeviceOpen: error setting periods for device (",0x3e);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc57;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc6e;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc75;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc80;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dc94;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dca8;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    if (((mode == INPUT) && (*(int *)(phandle + 0x1f8) == 0)) &&
       (*bufferSize != *(uint *)(phandle + 0x224))) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd3e;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd5a;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device ("
                 ,0x5a);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd6a;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd7e;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd92;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    *(uint *)(phandle + 0x224) = *bufferSize;
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d777;
    iVar9 = snd_pcm_hw_params(lVar2);
    lVar2 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dcb6;
      snd_pcm_close(lVar2);
      poVar16 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dcd2;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device (",
                 0x4f);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dce2;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dcf9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd00;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd0b;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd1f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      psVar22 = phandle;
      *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18dd33;
      std::__cxx11::stringbuf::str();
      goto LAB_0018dd92;
    }
    *(undefined8 *)(auStack_e8 + lVar14 + -8) = 0x18d786;
    lVar14 = snd_pcm_sw_params_sizeof();
    __s = __s + -(lVar14 + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)(__s + -8) = 0x18d79c;
    sVar15 = snd_pcm_sw_params_sizeof();
    *(undefined8 *)(__s + -8) = 0x18d7a9;
    memset(__s,0,sVar15);
    lVar14 = lStack_40;
    *(undefined8 *)(__s + -8) = 0x18d7b5;
    snd_pcm_sw_params_current(lVar14,__s);
    lVar14 = lStack_40;
    uVar13 = *bufferSize;
    *(undefined8 *)(__s + -8) = 0x18d7c7;
    snd_pcm_sw_params_set_start_threshold(lVar14,__s,uVar13);
    lVar14 = lStack_40;
    *(undefined8 *)(__s + -8) = 0x18d7da;
    snd_pcm_sw_params_set_stop_threshold(lVar14,__s,0xffffffffffffffff);
    lVar14 = lStack_40;
    *(undefined8 *)(__s + -8) = 0x18d7e8;
    snd_pcm_sw_params_set_silence_threshold(lVar14,__s,0);
    *(undefined8 *)(__s + -8) = 0x18d7f7;
    snd_pcm_sw_params_get_boundary(__s,&periodSize);
    psVar22 = phandle;
    lVar14 = lStack_40;
    *(undefined8 *)(__s + -8) = 0x18d80e;
    snd_pcm_sw_params_set_silence_size(lVar14,__s,periodSize);
    lVar14 = lStack_40;
    *(undefined8 *)(__s + -8) = 0x18d81a;
    iVar9 = snd_pcm_sw_params(lVar14);
    lVar14 = lStack_40;
    if (iVar9 < 0) {
      *(undefined8 *)(__s + -8) = 0x18ddf3;
      snd_pcm_close(lVar14);
      *(undefined8 *)(__s + -8) = 0x18de0b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(psVar22 + 8),
                 "RtApiAlsa::probeDeviceOpen: error installing software configuration on device (",
                 0x4f);
      _Var7 = name._M_dataplus;
      psVar6 = local_70;
      *(undefined8 *)(__s + -8) = 0x18de1b;
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(psVar22 + 8),(char *)psVar6,(long)_Var7._M_p);
      *(undefined8 *)(__s + -8) = 0x18de32;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"), ",3);
      *(undefined8 *)(__s + -8) = 0x18de39;
      pcVar17 = (char *)snd_strerror(iVar9);
      *(undefined8 *)(__s + -8) = 0x18de44;
      poVar16 = std::operator<<(poVar16,pcVar17);
      *(undefined8 *)(__s + -8) = 0x18de58;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      *(undefined8 *)(__s + -8) = 0x18de68;
      std::__cxx11::stringbuf::str();
      psVar21 = (string *)(psVar22 + 0x180);
      goto LAB_0018dda3;
    }
    psVar22[lStack_78 + 0x218] = (snd_pcm_t)0x0;
    lVar14 = *(long *)(psVar22 + 600);
    lVar2 = *(long *)(psVar22 + lStack_78 * 8 + 0x260);
    psVar22[lStack_78 + 0x218] = (snd_pcm_t)(lVar14 != lVar2);
    psVar22[lStack_78 + 0x218] =
         (snd_pcm_t)
         (*(uint *)(psVar22 + lStack_78 * 4 + 0x22c) < *(uint *)(psVar22 + lStack_78 * 4 + 0x234) ||
         lVar14 != lVar2);
    if ((psVar22[0x21a] != psVar22[lStack_78 + 0x21b]) &&
       (1 < *(uint *)(psVar22 + lStack_78 * 4 + 0x22c))) {
      psVar22[lStack_78 + 0x218] = (snd_pcm_t)0x1;
    }
    puVar19 = *(undefined8 **)(psVar22 + 0x1f0);
    if (puVar19 == (undefined8 *)0x0) {
      *(undefined8 *)(__s + -8) = 0x18de88;
      puVar19 = (undefined8 *)operator_new(0x50);
      *(undefined1 *)(puVar19 + 9) = 0;
      *puVar19 = 0;
      puVar19[1] = 0;
      *(undefined4 *)((long)puVar19 + 0xf) = 0;
      *(undefined8 *)(__s + -8) = 0x18deaa;
      iVar9 = pthread_cond_init((pthread_cond_t *)(puVar19 + 3),(pthread_condattr_t *)0x0);
      if (iVar9 == 0) {
        *(undefined8 **)(psVar22 + 0x1f0) = puVar19;
        *puVar19 = 0;
        puVar19[1] = 0;
        goto LAB_0018d8a3;
      }
      name.field_2._8_8_ = puVar19;
      *(undefined8 *)(__s + -8) = 0x18dec5;
      std::__cxx11::string::operator=
                ((string *)(psVar22 + 0x180),
                 "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.");
    }
    else {
LAB_0018d8a3:
      lVar14 = lStack_78;
      puVar19[lStack_78] = lStack_40;
      lStack_40 = 0;
      iVar9 = *(int *)(psVar22 + lStack_78 * 4 + 0x22c);
      uVar13 = *bufferSize;
      RVar3 = *(RtAudioFormat *)(psVar22 + 600);
      name.field_2._8_8_ = puVar19;
      *(undefined8 *)(__s + -8) = 0x18d8d8;
      uVar12 = RtApi::formatBytes((RtApi *)psVar22,RVar3);
      *(undefined8 *)(__s + -8) = 0x18d8ec;
      pvVar18 = calloc((ulong)(uVar13 * iVar9 * uVar12),1);
      psVar22 = phandle;
      *(void **)(phandle + lVar14 * 8 + 0x200) = pvVar18;
      if (pvVar18 != (void *)0x0) {
        if (phandle[lVar14 + 0x218] == (snd_pcm_t)0x1) {
          iVar9 = *(int *)(phandle + lVar14 * 4 + 0x234);
          RVar3 = *(RtAudioFormat *)(phandle + lVar14 * 8 + 0x260);
          *(undefined8 *)(__s + -8) = 0x18d925;
          uVar13 = RtApi::formatBytes((RtApi *)psVar22,RVar3);
          psVar22 = phandle;
          if (((mode == INPUT) && (*(int *)(phandle + 0x1f8) == 0)) &&
             (*(long *)(phandle + 0x210) != 0)) {
            iVar10 = *(int *)(phandle + 0x234);
            RVar3 = *(RtAudioFormat *)(phandle + 0x260);
            *(undefined8 *)(__s + -8) = 0x18d95f;
            uVar12 = RtApi::formatBytes((RtApi *)psVar22,RVar3);
            if (uVar12 * iVar10 < uVar13 * iVar9) goto LAB_0018d96b;
LAB_0018d9a4:
            iVar9 = 0;
          }
          else {
LAB_0018d96b:
            uVar12 = *bufferSize;
            pvVar18 = *(void **)(phandle + 0x210);
            if (pvVar18 != (void *)0x0) {
              *(undefined8 *)(__s + -8) = 0x18d983;
              free(pvVar18);
            }
            *(undefined8 *)(__s + -8) = 0x18d990;
            pvVar18 = calloc((ulong)uVar12 * (ulong)(uVar13 * iVar9),1);
            *(void **)(phandle + 0x210) = pvVar18;
            if (pvVar18 != (void *)0x0) goto LAB_0018d9a4;
            psVar21 = (string *)(phandle + 0x180);
            iVar9 = 9;
            *(undefined8 *)(__s + -8) = 0x18df0c;
            std::__cxx11::string::operator=
                      (psVar21,"RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.")
            ;
          }
          lVar14 = lStack_78;
          if (iVar9 != 0) {
            if (iVar9 != 9) goto LAB_0018ddc2;
            goto LAB_0018e10e;
          }
        }
        psVar22 = phandle;
        iVar9 = dir;
        *(uint *)(phandle + 0x220) = local_c0;
        *(uint *)(phandle + 0x228) = local_44;
        *(uint *)(phandle + lVar14 * 4 + 0x1e8) = deviceId;
        *(undefined4 *)(phandle + 0x1fc) = 0;
        if (phandle[lVar14 + 0x218] == (snd_pcm_t)0x1) {
          *(undefined8 *)(__s + -8) = 0x18df6a;
          RtApi::setConvertInfo((RtApi *)psVar22,mode,iVar9);
        }
        psVar22 = phandle;
        if ((mode == INPUT) && (*(int *)(phandle + 0x1f8) == 0)) {
          *(undefined4 *)(phandle + 0x1f8) = 2;
          *(undefined1 *)(name.field_2._8_8_ + 0x10) = 0;
          uVar4 = *(undefined8 *)name.field_2._8_8_;
          uVar5 = *(undefined8 *)(name.field_2._8_8_ + 8);
          *(undefined8 *)(__s + -8) = 0x18df9d;
          iVar9 = snd_pcm_link(uVar4,uVar5);
          if (iVar9 != 0) {
            psVar21 = (string *)(phandle + 0x180);
            *(undefined8 *)(__s + -8) = 0x18dfb8;
            std::__cxx11::string::operator=
                      (psVar21,
                       "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices."
                      );
            psVar22 = phandle;
            mode = INPUT;
            *(undefined8 *)(__s + -8) = 0x18dfc9;
            RtApi::error((RtApi *)psVar22,RTAUDIO_WARNING);
            goto LAB_0018ddc2;
          }
          *(undefined1 *)(name.field_2._8_8_ + 0x10) = 1;
        }
        else {
          *(StreamMode *)(phandle + 0x1f8) = mode;
          __arg = phandle + 0x298;
          *(snd_pcm_t **)(phandle + 0x298) = phandle;
          *(undefined8 *)(__s + -8) = 0x18dff2;
          pthread_attr_init((pthread_attr_t *)&sampleRate_local);
          *(undefined8 *)(__s + -8) = 0x18dffc;
          pthread_attr_setdetachstate((pthread_attr_t *)&sampleRate_local,0);
          if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
            *(undefined8 *)(__s + -8) = 0x18e018;
            pthread_attr_setschedpolicy((pthread_attr_t *)&sampleRate_local,0);
          }
          else {
            psVar22[0x2c1] = (snd_pcm_t)0x1;
            iVar9 = options->priority;
            *(undefined8 *)(__s + -8) = 0x18e03d;
            iVar10 = sched_get_priority_min(2);
            *(undefined8 *)(__s + -8) = 0x18e049;
            local_dc.__sched_priority = sched_get_priority_max(2);
            if (iVar9 < local_dc.__sched_priority) {
              local_dc.__sched_priority = iVar9;
            }
            if (iVar9 < iVar10) {
              local_dc.__sched_priority = iVar10;
            }
            *(undefined8 *)(__s + -8) = 0x18e073;
            pthread_attr_setschedpolicy((pthread_attr_t *)&sampleRate_local,2);
            *(undefined8 *)(__s + -8) = 0x18e07d;
            pthread_attr_setscope((pthread_attr_t *)&sampleRate_local,0);
            *(undefined8 *)(__s + -8) = 0x18e08a;
            pthread_attr_setinheritsched((pthread_attr_t *)&sampleRate_local,1);
            *(undefined8 *)(__s + -8) = 0x18e095;
            pthread_attr_setschedparam((pthread_attr_t *)&sampleRate_local,&local_dc);
          }
          psVar22[0x2c0] = (snd_pcm_t)0x1;
          *(undefined8 *)(__s + -8) = 0x18e0c0;
          iVar9 = pthread_create((pthread_t *)(psVar22 + 0x2a0),(pthread_attr_t *)&sampleRate_local,
                                 alsaCallbackHandler,__arg);
          *(undefined8 *)(__s + -8) = 0x18e0cb;
          pthread_attr_destroy((pthread_attr_t *)&sampleRate_local);
          if (iVar9 != 0) {
            *(undefined8 *)(__s + -8) = 0x18e0e8;
            iVar9 = pthread_create((pthread_t *)(psVar22 + 0x2a0),(pthread_attr_t *)0x0,
                                   alsaCallbackHandler,__arg);
            if (iVar9 != 0) {
              phandle[0x2c0] = (snd_pcm_t)0x0;
              psVar21 = (string *)(phandle + 0x180);
              *(undefined8 *)(__s + -8) = 0x18e10e;
              std::__cxx11::string::operator=(psVar21,"RtApiAlsa::error creating callback thread!");
              goto LAB_0018e10e;
            }
          }
        }
        mode = INPUT;
        goto LAB_0018ddc2;
      }
      psVar21 = (string *)(phandle + 0x180);
      *(undefined8 *)(__s + -8) = 0x18dedd;
      std::__cxx11::string::operator=
                (psVar21,"RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.");
    }
LAB_0018e10e:
    uVar4 = name.field_2._8_8_;
    if (name.field_2._8_8_ != 0) {
      __cond = (pthread_cond_t *)(name.field_2._8_8_ + 0x18);
      *(undefined8 *)(__s + -8) = 0x18e120;
      pthread_cond_destroy(__cond);
      if (*(long *)uVar4 != 0) {
        *(undefined8 *)(__s + -8) = 0x18e12d;
        snd_pcm_close();
      }
      if (*(long *)(name.field_2._8_8_ + 8) != 0) {
        *(undefined8 *)(__s + -8) = 0x18e13f;
        snd_pcm_close();
      }
      uVar4 = name.field_2._8_8_;
      *(undefined8 *)(__s + -8) = 0x18e148;
      operator_delete((void *)uVar4);
      *(undefined8 *)(phandle + 0x1f0) = 0;
    }
    if (lStack_40 != 0) {
      *(undefined8 *)(__s + -8) = 0x18e165;
      snd_pcm_close();
    }
    psVar22 = phandle;
    lVar14 = 0;
    do {
      pvVar18 = *(void **)(psVar22 + lVar14 * 8 + 0x200);
      if (pvVar18 != (void *)0x0) {
        *(undefined8 *)(__s + -8) = 0x18e17d;
        free(pvVar18);
        *(undefined8 *)(psVar22 + lVar14 * 8 + 0x200) = 0;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    pvVar18 = *(void **)(psVar22 + 0x210);
    if (pvVar18 != (void *)0x0) {
      *(undefined8 *)(__s + -8) = 0x18e1a3;
      free(pvVar18);
      *(undefined8 *)(psVar22 + 0x210) = 0;
    }
    *(undefined4 *)(psVar22 + 0x1fc) = 0xffffffce;
  }
  mode = OUTPUT;
LAB_0018ddc2:
  psVar6 = local_70;
  if (local_70 != &name._M_string_length) {
    *(undefined8 *)(__s + -8) = 0x18ddd4;
    operator_delete(psVar6);
  }
  return (bool)((byte)mode & 1);
}

Assistant:

bool RtApiAlsa :: probeDeviceOpen( unsigned int deviceId, StreamMode mode, unsigned int channels,
                                   unsigned int firstChannel, unsigned int sampleRate,
                                   RtAudioFormat format, unsigned int *bufferSize,
                                   RtAudio::StreamOptions *options )

{
#if defined(__RTAUDIO_DEBUG__)
  struct SndOutputTdealloc {
    SndOutputTdealloc() : _out(NULL) { snd_output_stdio_attach(&_out, stderr, 0); }
    ~SndOutputTdealloc() { snd_output_close(_out); }
    operator snd_output_t*() { return _out; }
    snd_output_t *_out;
  } out;
#endif

  std::string name;
  for ( auto& id : deviceIdPairs_) {
    if ( id.second == deviceId ) {
      name = id.first;
      break;
    }
  }

  snd_pcm_stream_t stream;
  if ( mode == OUTPUT )
    stream = SND_PCM_STREAM_PLAYBACK;
  else
    stream = SND_PCM_STREAM_CAPTURE;

  snd_pcm_t *phandle;
  int openMode = SND_PCM_ASYNC;
  int result = snd_pcm_open( &phandle, name.c_str(), stream, openMode );
  if ( result < 0 ) {
    if ( mode == OUTPUT )
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for output.";
    else
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for input.";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Fill the parameter structure.
  snd_pcm_hw_params_t *hw_params;
  snd_pcm_hw_params_alloca( &hw_params );
  result = snd_pcm_hw_params_any( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") parameters, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf( stderr, "\nRtApiAlsa: dump hardware params just after device open:\n\n" );
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set access ... check user preference.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) {
    stream_.userInterleaved = false;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
      stream_.deviceInterleaved[mode] =  true;
    }
    else
      stream_.deviceInterleaved[mode] = false;
  }
  else {
    stream_.userInterleaved = true;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
      stream_.deviceInterleaved[mode] =  false;
    }
    else
      stream_.deviceInterleaved[mode] =  true;
  }

  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") access, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine how to set the device format.
  stream_.userFormat = format;
  snd_pcm_format_t deviceFormat = SND_PCM_FORMAT_UNKNOWN;

  if ( format == RTAUDIO_SINT8 )
    deviceFormat = SND_PCM_FORMAT_S8;
  else if ( format == RTAUDIO_SINT16 )
    deviceFormat = SND_PCM_FORMAT_S16;
  else if ( format == RTAUDIO_SINT24 )
    deviceFormat = SND_PCM_FORMAT_S24;
  else if ( format == RTAUDIO_SINT32 )
    deviceFormat = SND_PCM_FORMAT_S32;
  else if ( format == RTAUDIO_FLOAT32 )
    deviceFormat = SND_PCM_FORMAT_FLOAT;
  else if ( format == RTAUDIO_FLOAT64 )
    deviceFormat = SND_PCM_FORMAT_FLOAT64;

  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat) == 0) {
    stream_.deviceFormat[mode] = format;
    goto setFormat;
  }

  // The user requested format is not natively supported by the device.
  deviceFormat = SND_PCM_FORMAT_FLOAT64;
  if ( snd_pcm_hw_params_test_format( phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT64;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_FLOAT;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S32;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S24;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT24;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S16;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT16;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S8;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT8;
    goto setFormat;
  }

  // If we get here, no supported format was found.
  snd_pcm_close( phandle );
  errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") data format not supported by RtAudio.";
  errorText_ = errorStream_.str();
  return FAILURE;

 setFormat:
  result = snd_pcm_hw_params_set_format( phandle, hw_params, deviceFormat );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") data format, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine whether byte-swaping is necessary.
  stream_.doByteSwap[mode] = false;
  if ( deviceFormat != SND_PCM_FORMAT_S8 ) {
    result = snd_pcm_format_cpu_endian( deviceFormat );
    if ( result == 0 )
      stream_.doByteSwap[mode] = true;
    else if (result < 0) {
      snd_pcm_close( phandle );
      errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") endian-ness, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      return FAILURE;
    }
  }

  // Set the sample rate.
  result = snd_pcm_hw_params_set_rate_near( phandle, hw_params, (unsigned int*) &sampleRate, 0 );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting sample rate on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine the number of channels for this device.  We support a possible
  // minimum device channel number > than the value requested by the user.
  stream_.nUserChannels[mode] = channels;
  unsigned int value;
  result = snd_pcm_hw_params_get_channels_max( hw_params, &value );
  unsigned int deviceChannels = value;
  if ( result < 0 || deviceChannels < channels + firstChannel ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  result = snd_pcm_hw_params_get_channels_min( hw_params, &value );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting minimum channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  deviceChannels = value;
  if ( deviceChannels < channels + firstChannel ) deviceChannels = channels + firstChannel;
  stream_.nDeviceChannels[mode] = deviceChannels;

  // Set the device channels.
  result = snd_pcm_hw_params_set_channels( phandle, hw_params, deviceChannels );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Set the buffer (or period) size.
  int dir = 0;
  snd_pcm_uframes_t periodSize = *bufferSize;
  result = snd_pcm_hw_params_set_period_size_near( phandle, hw_params, &periodSize, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting period size for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  *bufferSize = periodSize;

  // Set the buffer number, which in ALSA is referred to as the "period".
  unsigned int periods = 0;
  if ( options && options->flags & RTAUDIO_MINIMIZE_LATENCY ) periods = 2;
  if ( options && options->numberOfBuffers > 0 ) periods = options->numberOfBuffers;
  if ( periods < 2 ) periods = 4; // a fairly safe default value
  result = snd_pcm_hw_params_set_periods_near( phandle, hw_params, &periods, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting periods for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // If attempting to setup a duplex stream, the bufferSize parameter
  // MUST be the same in both directions!
  if ( stream_.mode == OUTPUT && mode == INPUT && *bufferSize != stream_.bufferSize ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device (" << name << ").";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  stream_.bufferSize = *bufferSize;

  // Install the hardware configuration
  result = snd_pcm_hw_params( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump hardware params after installation:\n\n");
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set the software configuration to fill buffers with zeros and prevent device stopping on xruns.
  snd_pcm_sw_params_t *sw_params = NULL;
  snd_pcm_sw_params_alloca( &sw_params );
  snd_pcm_sw_params_current( phandle, sw_params );
  snd_pcm_sw_params_set_start_threshold( phandle, sw_params, *bufferSize );
  snd_pcm_sw_params_set_stop_threshold( phandle, sw_params, ULONG_MAX );
  snd_pcm_sw_params_set_silence_threshold( phandle, sw_params, 0 );

  // The following two settings were suggested by Theo Veenker
  //snd_pcm_sw_params_set_avail_min( phandle, sw_params, *bufferSize );
  //snd_pcm_sw_params_set_xfer_align( phandle, sw_params, 1 );

  // here are two options for a fix
  //snd_pcm_sw_params_set_silence_size( phandle, sw_params, ULONG_MAX );
  snd_pcm_uframes_t val;
  snd_pcm_sw_params_get_boundary( sw_params, &val );
  snd_pcm_sw_params_set_silence_size( phandle, sw_params, val );

  result = snd_pcm_sw_params( phandle, sw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing software configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump software params after installation:\n\n");
  snd_pcm_sw_params_dump( sw_params, out );
#endif

  // Set flags for buffer conversion
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] &&
       stream_.nUserChannels[mode] > 1 )
    stream_.doConvertBuffer[mode] = true;

  // Allocate the ApiHandle if necessary and then save.
  AlsaHandle *apiInfo = 0;
  if ( stream_.apiHandle == 0 ) {
    try {
      apiInfo = (AlsaHandle *) new AlsaHandle;
    }
    catch ( std::bad_alloc& ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating AlsaHandle memory.";
      goto error;
    }

    if ( pthread_cond_init( &apiInfo->runnable_cv, NULL ) ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.";
      goto error;
    }

    stream_.apiHandle = (void *) apiInfo;
    apiInfo->handles[0] = 0;
    apiInfo->handles[1] = 0;
  }
  else {
    apiInfo = (AlsaHandle *) stream_.apiHandle;
  }
  apiInfo->handles[mode] = phandle;
  phandle = 0;

  // Allocate necessary internal buffers.
  unsigned long bufferBytes;
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.sampleRate = sampleRate;
  stream_.nBuffers = periods;
  stream_.deviceId[mode] = deviceId;
  stream_.state = STREAM_STOPPED;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  // Setup thread if necessary.
  if ( stream_.mode == OUTPUT && mode == INPUT ) {
    // We had already set up an output stream.
    stream_.mode = DUPLEX;
    // Link the streams if possible.
    apiInfo->synchronized = false;
    if ( snd_pcm_link( apiInfo->handles[0], apiInfo->handles[1] ) == 0 )
      apiInfo->synchronized = true;
    else {
      errorText_ = "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices.";
      error( RTAUDIO_WARNING );
    }
  }
  else {
    stream_.mode = mode;

    // Setup callback thread.
    stream_.callbackInfo.object = (void *) this;

    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;

      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    result = pthread_create( &stream_.callbackInfo.thread, &attr, alsaCallbackHandler, &stream_.callbackInfo );
    pthread_attr_destroy( &attr );
    if ( result ) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &stream_.callbackInfo.thread, NULL, alsaCallbackHandler, &stream_.callbackInfo );
      if ( result ) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiAlsa::error creating callback thread!";
        goto error;
      }
    }
  }

  return SUCCESS;

 error:
  if ( apiInfo ) {
    pthread_cond_destroy( &apiInfo->runnable_cv );
    if ( apiInfo->handles[0] ) snd_pcm_close( apiInfo->handles[0] );
    if ( apiInfo->handles[1] ) snd_pcm_close( apiInfo->handles[1] );
    delete apiInfo;
    stream_.apiHandle = 0;
  }

  if ( phandle) snd_pcm_close( phandle );

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}